

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_register_allocation.cpp
# Opt level: O0

void mocker::anon_unknown_2::allocate(LineIter funcBeg,LineIter funcEnd,Section *text)

{
  __node_base_ptr p_Var1;
  bool bVar2;
  reference pLVar3;
  shared_ptr<mocker::nasm::Register> *args_1;
  pointer pLVar4;
  Line local_188;
  shared_ptr<mocker::nasm::NumericConstant> local_158;
  OpType local_144;
  long local_140;
  size_t alignSz;
  shared_ptr<mocker::nasm::Inst> local_108;
  Line local_f8;
  shared_ptr<mocker::nasm::Inst> local_c8 [2];
  Line local_a8;
  _List_const_iterator<mocker::nasm::Line> local_78;
  LineIter lineIter;
  size_t vRegCnt;
  undefined1 local_58 [8];
  RegMap<std::size_t> offsets;
  Section *text_local;
  LineIter funcEnd_local;
  LineIter funcBeg_local;
  
  offsets._M_h._M_single_bucket = (__node_base_ptr)text;
  text_local = (Section *)funcEnd._M_node;
  funcEnd_local = funcBeg;
  buildVReg2Offsets((RegMap<std::size_t> *)local_58,funcBeg,funcEnd);
  lineIter._M_node =
       (_List_node_base *)
       std::
       unordered_map<std::shared_ptr<mocker::nasm::Register>,_unsigned_long,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>_>
       ::size((RegMap<std::size_t> *)local_58);
  p_Var1 = offsets._M_h._M_single_bucket;
  local_78._M_node = funcEnd_local._M_node;
  pLVar3 = std::_List_const_iterator<mocker::nasm::Line>::operator*(&local_78);
  nasm::Line::Line(&local_a8,pLVar3);
  nasm::Section::appendLine((Section *)p_Var1,&local_a8);
  nasm::Line::~Line(&local_a8);
  std::_List_const_iterator<mocker::nasm::Line>::operator++(&local_78);
  std::_List_const_iterator<mocker::nasm::Line>::operator->(&local_78);
  nasm::dyc<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Inst>const&>(local_c8);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_c8);
  if (!bVar2) {
    __assert_fail("nasm::dyc<nasm::Push>(lineIter->inst)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                  ,0xf8,
                  "void mocker::(anonymous namespace)::allocate(LineIter, LineIter, nasm::Section &)"
                 );
  }
  std::shared_ptr<mocker::nasm::Push>::~shared_ptr((shared_ptr<mocker::nasm::Push> *)local_c8);
  p_Var1 = offsets._M_h._M_single_bucket;
  pLVar3 = std::_List_const_iterator<mocker::nasm::Line>::operator*(&local_78);
  nasm::Line::Line(&local_f8,pLVar3);
  nasm::Section::appendLine((Section *)p_Var1,&local_f8);
  nasm::Line::~Line(&local_f8);
  std::_List_const_iterator<mocker::nasm::Line>::operator++(&local_78);
  std::_List_const_iterator<mocker::nasm::Line>::operator->(&local_78);
  nasm::dyc<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Inst>const&>(&local_108);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_108);
  if (bVar2) {
    std::shared_ptr<mocker::nasm::Mov>::~shared_ptr((shared_ptr<mocker::nasm::Mov> *)&local_108);
    p_Var1 = offsets._M_h._M_single_bucket;
    pLVar3 = std::_List_const_iterator<mocker::nasm::Line>::operator*(&local_78);
    nasm::Line::Line((Line *)&alignSz,pLVar3);
    nasm::Section::appendLine((Section *)p_Var1,(Line *)&alignSz);
    nasm::Line::~Line((Line *)&alignSz);
    std::_List_const_iterator<mocker::nasm::Line>::operator++(&local_78);
    p_Var1 = offsets._M_h._M_single_bucket;
    local_140 = (long)lineIter._M_node * 8 + ((ulong)lineIter._M_node & 1) * -8 + 0x10;
    if (local_140 != 0) {
      local_144 = Sub;
      args_1 = nasm::rsp();
      std::make_shared<mocker::nasm::NumericConstant,unsigned_long&>((unsigned_long *)&local_158);
      nasm::Section::
      emplaceInst<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::NumericConstant>>
                ((Section *)p_Var1,&local_144,args_1,&local_158);
      std::shared_ptr<mocker::nasm::NumericConstant>::~shared_ptr(&local_158);
    }
    while (bVar2 = std::operator!=(&local_78,(_Self *)&text_local), bVar2) {
      pLVar4 = std::_List_const_iterator<mocker::nasm::Line>::operator->(&local_78);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pLVar4->inst);
      p_Var1 = offsets._M_h._M_single_bucket;
      if (bVar2) {
        pLVar4 = std::_List_const_iterator<mocker::nasm::Line>::operator->(&local_78);
        allocate(&pLVar4->inst,(RegMap<std::size_t> *)local_58,
                 (Section *)offsets._M_h._M_single_bucket);
      }
      else {
        pLVar3 = std::_List_const_iterator<mocker::nasm::Line>::operator*(&local_78);
        nasm::Line::Line(&local_188,pLVar3);
        nasm::Section::appendLine((Section *)p_Var1,&local_188);
        nasm::Line::~Line(&local_188);
      }
      std::_List_const_iterator<mocker::nasm::Line>::operator++(&local_78);
    }
    std::
    unordered_map<std::shared_ptr<mocker::nasm::Register>,_unsigned_long,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>_>
    ::~unordered_map((unordered_map<std::shared_ptr<mocker::nasm::Register>,_unsigned_long,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>_>
                      *)local_58);
    return;
  }
  __assert_fail("nasm::dyc<nasm::Mov>(lineIter->inst)",
                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                ,0xfb,
                "void mocker::(anonymous namespace)::allocate(LineIter, LineIter, nasm::Section &)")
  ;
}

Assistant:

void allocate(LineIter funcBeg, LineIter funcEnd, nasm::Section &text) {
  RegMap<std::size_t> offsets = buildVReg2Offsets(funcBeg, funcEnd);
  std::size_t vRegCnt = offsets.size();

  auto lineIter = funcBeg;
  text.appendLine(*lineIter);
  ++lineIter;
  assert(nasm::dyc<nasm::Push>(lineIter->inst));
  text.appendLine(*lineIter);
  ++lineIter;
  assert(nasm::dyc<nasm::Mov>(lineIter->inst));
  text.appendLine(*lineIter);
  ++lineIter;
  // align
  std::size_t alignSz = 8 * vRegCnt + (16 - (8 * vRegCnt) % 16);
  if (alignSz)
    text.emplaceInst<nasm::BinaryInst>(
        nasm::BinaryInst::Sub, nasm::rsp(),
        std::make_shared<nasm::NumericConstant>(alignSz));

  for (; lineIter != funcEnd; ++lineIter) {
    if (!lineIter->inst) {
      text.appendLine(*lineIter);
      continue;
    }
    allocate(lineIter->inst, offsets, text);
  }
}